

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O1

void QIconModeViewBase::addLeaf(QList<int> *leaf,QRect *area,uint visited,Data data)

{
  undefined4 uVar1;
  long lVar2;
  long *plVar3;
  QList<QModelIndex> *this;
  char cVar4;
  undefined4 uVar5;
  pointer pQVar6;
  ulong uVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QModelIndex local_68;
  QModelIndex local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((leaf->d).size != 0) {
    uVar7 = 0;
    do {
      uVar8 = (ulong)(leaf->d).ptr[uVar7];
      if ((-1 < (long)uVar8) && (uVar8 < *(ulong *)((long)data.field_0 + 0x70))) {
        pQVar6 = QList<QListViewItem>::data((QList<QListViewItem> *)((long)data.field_0 + 0x60));
        if ((pQVar6[uVar8].x <= (int)pQVar6[uVar8].w + pQVar6[uVar8].x + -1) &&
           ((pQVar6[uVar8].y <= (int)pQVar6[uVar8].h + pQVar6[uVar8].y + -1 &&
            (-1 < pQVar6[uVar8].indexHint)))) {
          pQVar6 = pQVar6 + uVar8;
          local_50.r = pQVar6->x;
          local_50.c = pQVar6->y;
          local_50.i = CONCAT44((int)pQVar6->h + pQVar6->y + -1,(int)pQVar6->w + pQVar6->x + -1);
          cVar4 = QRect::intersects((QRect *)&local_50);
          if ((cVar4 != '\0') && (pQVar6->visited != visited)) {
            local_68.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
            local_68.r = -0x55555556;
            local_68.c = -0x55555556;
            local_68.i._0_4_ = 0xaaaaaaaa;
            local_68.i._4_4_ = 0xaaaaaaaa;
            lVar2 = *(long *)((long)data.field_0 + 8);
            plVar3 = *(long **)(lVar2 + 0x2f8);
            uVar5 = (**(code **)(**(long **)(lVar2 + 0x540) + 0x10))
                              (*(long **)(lVar2 + 0x540),pQVar6);
            uVar1 = *(undefined4 *)(lVar2 + 0x590);
            QPersistentModelIndex::operator_cast_to_QModelIndex
                      (&local_50,(QPersistentModelIndex *)(lVar2 + 0x3b8));
            (**(code **)(*plVar3 + 0x60))(&local_68,plVar3,uVar5,uVar1,&local_50);
            this = *(QList<QModelIndex> **)((long)data.field_0 + 0xb0);
            QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
                      ((QMovableArrayOps<QModelIndex> *)this,(this->d).size,&local_68);
            QList<QModelIndex>::end(this);
            pQVar6->visited = visited;
          }
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(leaf->d).size);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QIconModeViewBase::addLeaf(QList<int> &leaf, const QRect &area, uint visited,
                                QBspTree::Data data)
{
    QListViewItem *vi;
    QIconModeViewBase *_this = static_cast<QIconModeViewBase *>(data.ptr);
    for (int i = 0; i < leaf.size(); ++i) {
        int idx = leaf.at(i);
        if (idx < 0 || idx >= _this->items.size())
            continue;
        vi = &_this->items[idx];
        Q_ASSERT(vi);
        if (vi->isValid() && vi->rect().intersects(area) && vi->visited != visited) {
            QModelIndex index  = _this->dd->listViewItemToIndex(*vi);
            Q_ASSERT(index.isValid());
            _this->interSectingVector->append(index);
            vi->visited = visited;
        }
    }
}